

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::SIMDShuffle::finalize(SIMDShuffle *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  pEVar1 = this->left;
  if ((pEVar1 != (Expression *)0x0) && (pEVar2 = this->right, pEVar2 != (Expression *)0x0)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression.type.id = 6;
    if (((pEVar1->type).id == 1) || ((pEVar2->type).id == 1)) {
      (this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression.type.id = 1;
    }
    return;
  }
  __assert_fail("left && right",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x19a,"void wasm::SIMDShuffle::finalize()");
}

Assistant:

void SIMDShuffle::finalize() {
  assert(left && right);
  type = Type::v128;
  if (left->type == Type::unreachable || right->type == Type::unreachable) {
    type = Type::unreachable;
  }
}